

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_generic::try_direct_conversions(type_caster_generic *this,handle src)

{
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *pvVar1;
  pointer pp_Var2;
  pointer pp_Var3;
  bool bVar4;
  pointer pp_Var5;
  _func_bool__object_ptr_void_ptr_ptr **converter;
  
  pvVar1 = this->typeinfo->direct_conversions;
  pp_Var2 = (pvVar1->
            super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pp_Var3 = (pvVar1->
            super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    pp_Var5 = pp_Var3;
    if (pp_Var5 == pp_Var2) break;
    bVar4 = (**pp_Var5)(src.m_ptr,&this->value);
    pp_Var3 = pp_Var5 + 1;
  } while (!bVar4);
  return pp_Var5 != pp_Var2;
}

Assistant:

bool try_direct_conversions(handle src) {
        for (auto &converter : *typeinfo->direct_conversions) {
            if (converter(src.ptr(), value))
                return true;
        }
        return false;
    }